

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O1

errr Term_fresh(void)

{
  _Bool _Var1;
  int iVar2;
  wchar_t wVar3;
  int **ppiVar4;
  wchar_t **ppwVar5;
  int **ppiVar6;
  wchar_t **ppwVar7;
  int *piVar8;
  wchar_t *pwVar9;
  wchar_t *pwVar10;
  int *piVar11;
  int *piVar12;
  term_win *ptVar13;
  int iVar14;
  term *ptVar15;
  uint uVar16;
  uint uVar17;
  wchar_t wVar18;
  wchar_t wVar19;
  wchar_t wVar20;
  void *p;
  void *pvVar21;
  long lVar22;
  wchar_t *pwVar23;
  int iVar24;
  wchar_t *pwVar25;
  term_win *ptVar26;
  wchar_t wVar27;
  int *piVar28;
  int iVar29;
  wchar_t wVar30;
  int iVar31;
  wchar_t y;
  wchar_t *pwVar32;
  ulong uVar33;
  wchar_t *pwVar34;
  ulong uVar35;
  wchar_t *pwVar36;
  long lVar37;
  wchar_t wVar38;
  term_win *ptVar39;
  wchar_t *pwVar40;
  long lVar41;
  long lVar42;
  bool bVar43;
  wchar_t na;
  wchar_t nta;
  wchar_t nc;
  int *local_190;
  wchar_t *local_170;
  wchar_t local_164;
  wchar_t *local_160;
  wchar_t local_154;
  wchar_t *local_150;
  wchar_t *local_148;
  int local_13c;
  wchar_t *local_138;
  wchar_t *local_130;
  wchar_t local_124;
  wchar_t *local_120;
  wchar_t local_114;
  wchar_t *local_110;
  ulong local_108;
  void *local_100;
  term_win *local_f8;
  wchar_t *local_f0;
  wchar_t *local_e8;
  wchar_t local_e0;
  wchar_t local_dc;
  term_win *local_d8;
  ulong local_d0;
  wchar_t local_c8;
  wchar_t local_c4;
  wchar_t *local_c0;
  wchar_t *local_b8;
  wchar_t *local_b0;
  int *local_a8;
  wchar_t *local_a0;
  int *local_98;
  wchar_t *local_90;
  wchar_t *local_88;
  int *local_80;
  wchar_t *local_78;
  wchar_t *local_70;
  wchar_t *local_68;
  int *local_60;
  wchar_t *local_58;
  size_t local_50;
  int *local_48;
  wchar_t *local_40;
  int *local_38;
  
  ptVar15 = Term;
  if (Term->mapped_flag != true) {
    return 1;
  }
  local_d0 = (ulong)(uint)Term->wid;
  uVar17 = Term->hgt;
  iVar29 = Term->y1;
  local_13c = Term->y2;
  ptVar39 = Term->old;
  local_d8 = Term->scr;
  if ((((local_13c < iVar29) && (local_d8->cu == ptVar39->cu)) && (local_d8->cv == ptVar39->cv)) &&
     (((local_d8->cx == ptVar39->cx && (local_d8->cy == ptVar39->cy)) &&
      ((local_d8->cnx == ptVar39->cnx &&
       ((local_d8->cny == ptVar39->cny && (Term->total_erase != true)))))))) {
    return 1;
  }
  if (Term->curs_hook == (_func_errr_wchar_t_wchar_t *)0x0) {
    Term->curs_hook = Term_curs_hack;
  }
  if (ptVar15->bigcurs_hook == (_func_errr_wchar_t_wchar_t *)0x0) {
    ptVar15->bigcurs_hook = ptVar15->curs_hook;
  }
  if (ptVar15->wipe_hook == (_func_errr_wchar_t_wchar_t_wchar_t *)0x0) {
    ptVar15->wipe_hook = Term_wipe_hack;
  }
  if (ptVar15->text_hook == (_func_errr_wchar_t_wchar_t_wchar_t_wchar_t_wchar_t_ptr *)0x0) {
    ptVar15->text_hook = Term_text_hack;
  }
  if (ptVar15->pict_hook ==
      (_func_errr_wchar_t_wchar_t_wchar_t_wchar_t_ptr_wchar_t_ptr_wchar_t_ptr_wchar_t_ptr *)0x0) {
    ptVar15->pict_hook = Term_pict_hack;
  }
  if (ptVar15->total_erase == true) {
    if (ptVar15->xtra_hook != (_func_errr_wchar_t_wchar_t *)0x0) {
      (*ptVar15->xtra_hook)(L'\x03',L'\0');
    }
    ptVar39->cu = false;
    ptVar39->cv = false;
    ptVar39->cx = 0;
    ptVar39->cy = 0;
    ptVar39->cnx = 1;
    ptVar39->cny = 1;
    iVar29 = (int)local_d0;
    if (0 < (int)uVar17) {
      ppiVar4 = ptVar39->a;
      ppwVar5 = ptVar39->c;
      ppiVar6 = ptVar39->ta;
      ppwVar7 = ptVar39->tc;
      uVar33 = 0;
      do {
        if (0 < iVar29) {
          pwVar40 = ppwVar7[uVar33];
          piVar28 = ppiVar6[uVar33];
          pwVar32 = ppwVar5[uVar33];
          piVar8 = ppiVar4[uVar33];
          lVar37 = 0;
          do {
            piVar8[lVar37] = 1;
            pwVar32[lVar37] = L' ';
            piVar28[lVar37] = 1;
            pwVar40[lVar37] = L' ';
            lVar37 = lVar37 + 1;
          } while (iVar29 != (int)lVar37);
        }
        uVar33 = uVar33 + 1;
      } while (uVar33 != uVar17);
    }
    ptVar15 = Term;
    Term->y1 = 0;
    local_13c = uVar17 - 1;
    ptVar15->y2 = local_13c;
    if (0 < (int)uVar17) {
      piVar28 = ptVar15->x1;
      piVar8 = ptVar15->x2;
      uVar33 = 0;
      do {
        piVar28[uVar33] = 0;
        piVar8[uVar33] = iVar29 + -1;
        uVar33 = uVar33 + 1;
      } while (uVar17 != uVar33);
    }
    ptVar15->total_erase = false;
    iVar29 = 0;
  }
  iVar31 = local_13c;
  if (Term->soft_cursor == true) {
    if ((ptVar39->cu == false) && (ptVar39->cv == true)) {
      iVar2 = ptVar39->cy;
      lVar37 = (long)iVar2;
      uVar16 = ptVar39->cny + iVar2;
      if ((int)uVar17 <= (int)uVar16) {
        uVar16 = uVar17;
      }
      iVar31 = uVar16 - 1;
      if ((int)(uVar16 - 1) < iVar2) {
        iVar31 = iVar2;
      }
      iVar2 = ptVar39->cx;
      iVar24 = ptVar39->cnx + iVar2;
      if ((int)local_d0 <= iVar24) {
        iVar24 = (int)local_d0;
      }
      iVar14 = iVar24 + -1;
      if (iVar24 + -1 < iVar2) {
        iVar14 = iVar2;
      }
      piVar28 = Term->x1;
      piVar8 = Term->x2;
      do {
        iVar2 = ptVar39->cx;
        if (iVar2 <= iVar14) {
          pwVar40 = local_d8->c[lVar37];
          pwVar32 = ptVar39->c[lVar37];
          lVar42 = 0;
          do {
            pwVar32[iVar2 + lVar42] = ~pwVar40[iVar2 + lVar42];
            lVar42 = lVar42 + 1;
          } while ((iVar14 + 1) - iVar2 != (int)lVar42);
        }
        if (ptVar39->cx < piVar28[lVar37]) {
          piVar28[lVar37] = ptVar39->cx;
        }
        if (piVar8[lVar37] < iVar14) {
          piVar8[lVar37] = iVar14;
        }
        lVar37 = lVar37 + 1;
      } while (iVar31 + 1 != (int)lVar37);
      if (ptVar39->cy <= iVar29) {
        iVar29 = ptVar39->cy;
      }
      if (iVar31 < local_13c) {
        iVar31 = local_13c;
      }
    }
  }
  else if (((local_d8->cu != false) || (local_d8->cv == false)) &&
          (Term->xtra_hook != (_func_errr_wchar_t_wchar_t *)0x0)) {
    (*Term->xtra_hook)(L'\x04',L'\0');
    iVar31 = local_13c;
  }
  local_13c = iVar31;
  if (iVar29 <= local_13c) {
    if ((Term->dblh_hook == (_func_wchar_t_wchar_t_wchar_t *)0x0) ||
       ((Term->always_pict == false && (Term->higher_pict != true)))) {
      p = (void *)0x0;
    }
    else {
      p = mem_alloc((ulong)tile_height << 3);
      if (tile_height != '\0') {
        lVar37 = (long)(int)local_d0;
        uVar33 = 0;
        do {
          pvVar21 = mem_zalloc(lVar37 << 2);
          *(void **)((long)p + uVar33 * 8) = pvVar21;
          uVar33 = uVar33 + 1;
        } while (uVar33 < tile_height);
      }
    }
    ptVar15 = Term;
    if ((Term->icky_corner == true) && ((int)(uVar17 - 1) <= local_13c)) {
      iVar31 = (int)local_d0 + -2;
      if (iVar31 < Term->x2[(long)(int)uVar17 + -1]) {
        Term->x2[(long)(int)uVar17 + -1] = iVar31;
      }
    }
    ptVar15->y1 = uVar17;
    ptVar15->y2 = 0;
    if (iVar29 <= local_13c) {
      local_50 = local_d0 * 4;
      lVar37 = (long)iVar29;
      local_13c = local_13c + 1;
      uVar33 = 0;
      local_100 = p;
      local_f8 = ptVar39;
      do {
        ptVar15 = Term;
        piVar28 = Term->x2;
        uVar17 = Term->x1[lVar37];
        lVar42 = (long)(int)uVar17;
        uVar16 = piVar28[lVar37];
        pwVar40 = (wchar_t *)(long)(int)uVar16;
        iVar29 = (int)uVar33;
        if ((int)uVar16 < (int)uVar17) {
          if (p != (void *)0x0) {
            if (0 < (int)local_d0) {
              memset(*(void **)((long)p + (long)iVar29 * 8),0,local_50);
            }
            uVar33 = (long)(iVar29 + 1) % (long)(int)(uint)tile_height & 0xffffffff;
          }
        }
        else {
          uVar35 = (ulong)uVar17;
          Term->x1[lVar37] = (int)local_d0;
          piVar28[lVar37] = 0;
          y = (wchar_t)lVar37;
          local_120 = pwVar40;
          if (ptVar15->always_pict == true) {
            if (ptVar15->dblh_hook == (_func_wchar_t_wchar_t_wchar_t *)0x0) {
              ptVar39 = ptVar15->old;
              ptVar26 = ptVar15->scr;
              piVar28 = ptVar26->a[lVar37];
              pwVar9 = ptVar26->c[lVar37];
              piVar8 = ptVar26->ta[lVar37];
              pwVar25 = ptVar26->tc[lVar37];
              local_120 = (wchar_t *)(ulong)((uVar16 - uVar17) + 1);
              pwVar40 = pwVar25 + lVar42;
              pwVar32 = piVar8 + lVar42;
              pwVar10 = ptVar39->tc[lVar37];
              piVar11 = ptVar39->ta[lVar37];
              pwVar36 = pwVar9 + lVar42;
              pwVar34 = ptVar39->c[lVar37];
              piVar12 = ptVar39->a[lVar37];
              local_160 = piVar28 + lVar42;
              lVar22 = 0;
              wVar30 = L'\0';
              wVar38 = L'\0';
              local_150 = pwVar40;
              local_138 = pwVar32;
              local_130 = pwVar36;
              do {
                wVar19 = pwVar36[lVar22];
                wVar20 = pwVar32[lVar22];
                wVar27 = pwVar40[lVar22];
                if (((local_160[lVar22] == piVar12[lVar42 + lVar22]) &&
                    (wVar19 == pwVar34[lVar42 + lVar22])) &&
                   ((wVar20 == piVar11[lVar42 + lVar22] && (wVar27 == pwVar10[lVar42 + lVar22])))) {
                  if (wVar30 != L'\0') {
                    (*Term->pict_hook)(wVar38,y,wVar30,piVar28 + wVar38,pwVar9 + wVar38,
                                       piVar8 + wVar38,pwVar25 + wVar38);
                    pwVar40 = local_150;
                    pwVar32 = local_138;
                    pwVar36 = local_130;
                  }
                  wVar30 = L'\0';
                }
                else {
                  piVar12[lVar42 + lVar22] = local_160[lVar22];
                  pwVar34[lVar42 + lVar22] = wVar19;
                  piVar11[lVar42 + lVar22] = wVar20;
                  pwVar10[lVar42 + lVar22] = wVar27;
                  bVar43 = wVar30 == L'\0';
                  wVar30 = wVar30 + L'\x01';
                  if (bVar43) {
                    wVar38 = uVar17 + (int)lVar22;
                  }
                }
                lVar22 = lVar22 + 1;
              } while ((int)local_120 != (int)lVar22);
              p = local_100;
              ptVar39 = local_f8;
              if (wVar30 != L'\0') {
                (*Term->pict_hook)(wVar38,y,wVar30,piVar28 + wVar38,pwVar9 + wVar38,piVar8 + wVar38,
                                   pwVar25 + wVar38);
                p = local_100;
                ptVar39 = local_f8;
              }
            }
            else {
              ptVar39 = ptVar15->old;
              ptVar26 = ptVar15->scr;
              local_98 = ptVar26->a[lVar37];
              local_a0 = ptVar26->c[lVar37];
              local_a8 = ptVar26->ta[lVar37];
              local_b0 = ptVar26->tc[lVar37];
              piVar28 = local_a8;
              pwVar40 = local_a0;
              local_138 = local_98;
              pwVar32 = local_b0;
              local_190 = local_a8;
              local_170 = local_b0;
              local_160 = local_a0;
              local_150 = local_98;
              if (lVar37 < (long)((long)ptVar15->hgt - (ulong)tile_height)) {
                lVar22 = (ulong)tile_height + lVar37;
                local_150 = ptVar26->a[lVar22];
                pwVar40 = ptVar26->c[lVar22];
                piVar28 = ptVar26->ta[lVar22];
                pwVar32 = ptVar26->tc[lVar22];
                local_138 = ptVar39->a[lVar22];
                local_160 = ptVar39->c[lVar22];
                local_190 = ptVar39->ta[lVar22];
                local_170 = ptVar39->tc[lVar22];
              }
              local_148 = *(wchar_t **)((long)p + (long)iVar29 * 8);
              local_130 = ptVar39->a[lVar37];
              pwVar9 = ptVar39->c[lVar37];
              piVar8 = ptVar39->ta[lVar37];
              pwVar36 = ptVar39->tc[lVar37];
              if (0 < (int)uVar17) {
                memset(local_148,0,uVar35 * 4);
              }
              pwVar10 = local_130;
              local_78 = pwVar32 + lVar42;
              local_80 = piVar28 + lVar42;
              local_88 = pwVar40 + lVar42;
              local_90 = local_150 + lVar42;
              local_c0 = local_170 + lVar42;
              local_38 = local_190 + lVar42;
              local_40 = local_160 + lVar42;
              local_48 = local_138 + lVar42;
              pwVar40 = local_148 + lVar42;
              uVar33 = (ulong)(((int)local_120 - uVar17) + 1);
              pwVar32 = local_b0 + lVar42;
              pwVar36 = pwVar36 + lVar42;
              pwVar25 = piVar8 + lVar42;
              local_150 = local_a8 + lVar42;
              local_138 = local_a0 + lVar42;
              local_130 = local_98 + lVar42;
              lVar41 = 0;
              pwVar23 = (wchar_t *)0x0;
              wVar38 = L'\0';
              pwVar34 = local_148;
              lVar22 = lVar42;
              local_110 = pwVar36;
              local_108 = uVar33;
              local_f0 = pwVar25;
              local_e8 = pwVar32;
              local_b8 = pwVar40;
              do {
                wVar30 = local_130[lVar41];
                wVar19 = local_138[lVar41];
                wVar20 = local_150[lVar41];
                wVar27 = pwVar32[lVar41];
                local_160 = pwVar23;
                if (((wVar30 == pwVar10[lVar42 + lVar41]) && (wVar19 == pwVar9[lVar42 + lVar41])) &&
                   ((wVar20 == pwVar25[lVar41] && (wVar27 == pwVar36[lVar41])))) {
                  pwVar23 = pwVar40;
                  if ((local_b8[lVar41] != L'\0') &&
                     ((wVar18 = (*Term->dblh_hook)(wVar30,wVar19), uVar33 = local_108,
                      pwVar34 = local_148, pwVar32 = local_e8, pwVar36 = local_110,
                      pwVar25 = local_f0, wVar18 != L'\0' ||
                      (wVar18 = (*Term->dblh_hook)(wVar20,wVar27), uVar33 = local_108,
                      pwVar34 = local_148, pwVar32 = local_e8, pwVar36 = local_110,
                      pwVar25 = local_f0, wVar18 != L'\0')))) goto LAB_001eff5e;
                  local_c4 = local_48[lVar41];
                  local_dc = local_38[lVar41];
                  local_e0 = local_c0[lVar41];
                  local_c8 = local_90[lVar41];
                  local_60 = (int *)CONCAT44(local_60._4_4_,local_88[lVar41]);
                  local_68 = (wchar_t *)CONCAT44(local_68._4_4_,local_80[lVar41]);
                  local_70 = (wchar_t *)CONCAT44(local_70._4_4_,local_78[lVar41]);
                  local_58 = (wchar_t *)CONCAT44(local_58._4_4_,local_40[lVar41]);
                  wVar18 = (*Term->dblh_hook)(local_c4,local_40[lVar41]);
                  if ((wVar18 != L'\0') ||
                     (wVar18 = (*Term->dblh_hook)(local_dc,local_e0), wVar18 != L'\0')) {
                    uVar33 = local_108;
                    pwVar34 = local_148;
                    pwVar32 = local_e8;
                    pwVar36 = local_110;
                    pwVar25 = local_f0;
                    if (local_c8 == local_c4) {
                      if ((((int)local_60 == (int)local_58) && ((wchar_t)local_68 == local_dc)) &&
                         ((wchar_t)local_70 == local_e0)) goto LAB_001efec1;
                    }
                    goto LAB_001eff5e;
                  }
LAB_001efec1:
                  local_b8[lVar41] = L'\0';
                  if ((wchar_t)local_160 != L'\0') {
                    (*Term->pict_hook)(wVar38,y,(wchar_t)local_160,local_98 + wVar38,
                                       local_a0 + wVar38,local_a8 + wVar38,local_b0 + wVar38);
                  }
                  wVar30 = L'\0';
                  uVar33 = local_108;
                  pwVar34 = local_148;
                  pwVar32 = local_e8;
                  pwVar36 = local_110;
                  pwVar25 = local_f0;
                }
                else {
                  pwVar23 = pwVar34 + lVar22;
LAB_001eff5e:
                  *pwVar23 = L'\x01';
                  pwVar10[lVar42 + lVar41] = wVar30;
                  pwVar9[lVar42 + lVar41] = wVar19;
                  pwVar25[lVar41] = wVar20;
                  pwVar36[lVar41] = wVar27;
                  wVar30 = (int)local_160 + L'\x01';
                  if ((int)local_160 == 0) {
                    wVar38 = uVar17 + (int)lVar41;
                  }
                }
                ptVar39 = local_f8;
                p = local_100;
                pwVar23 = (wchar_t *)(ulong)(uint)wVar30;
                lVar22 = lVar22 + 1;
                lVar41 = lVar41 + 1;
                pwVar40 = pwVar40 + 1;
              } while ((int)uVar33 != (int)lVar41);
              if (wVar30 != L'\0') {
                (*Term->pict_hook)(wVar38,y,wVar30,local_98 + wVar38,local_a0 + wVar38,
                                   local_a8 + wVar38,local_b0 + wVar38);
                pwVar34 = local_148;
              }
              ptVar15 = Term;
              lVar42 = (long)local_120 + 1;
              if ((int)lVar42 < Term->wid) {
                do {
                  pwVar34[lVar42] = L'\0';
                  lVar42 = lVar42 + 1;
                } while (lVar42 < ptVar15->wid);
              }
LAB_001f0f6c:
              uVar33 = (ulong)(uint)((iVar29 + 1) % (int)(uint)tile_height);
            }
          }
          else if (ptVar15->higher_pict == true) {
            if (ptVar15->dblh_hook != (_func_wchar_t_wchar_t_wchar_t *)0x0) {
              ptVar39 = ptVar15->old;
              ptVar26 = ptVar15->scr;
              local_f0 = ptVar26->a[lVar37];
              local_110 = ptVar26->c[lVar37];
              local_150 = ptVar26->ta[lVar37];
              pwVar40 = ptVar26->tc[lVar37];
              pwVar32 = local_f0;
              local_e8 = local_f0;
              local_190 = local_150;
              local_170 = pwVar40;
              local_160 = local_110;
              local_148 = pwVar40;
              local_138 = local_110;
              local_130 = local_150;
              if (lVar37 < (long)((long)ptVar15->hgt - (ulong)tile_height)) {
                lVar22 = (ulong)tile_height + lVar37;
                pwVar32 = ptVar26->a[lVar22];
                local_138 = ptVar26->c[lVar22];
                local_130 = ptVar26->ta[lVar22];
                local_148 = ptVar26->tc[lVar22];
                local_e8 = ptVar39->a[lVar22];
                local_160 = ptVar39->c[lVar22];
                local_190 = ptVar39->ta[lVar22];
                local_170 = ptVar39->tc[lVar22];
              }
              local_c0 = *(wchar_t **)((long)local_100 + (long)iVar29 * 8);
              piVar28 = ptVar39->a[lVar37];
              pwVar36 = ptVar39->c[lVar37];
              piVar8 = ptVar39->ta[lVar37];
              pwVar9 = ptVar39->tc[lVar37];
              local_108 = CONCAT71(local_108._1_7_,ptVar15->always_text);
              if (0 < (int)uVar17) {
                memset(local_c0,0,uVar35 * 4);
              }
              pwVar10 = local_c0;
              local_58 = local_148 + lVar42;
              local_60 = local_130 + lVar42;
              local_68 = local_138 + lVar42;
              local_70 = pwVar32 + lVar42;
              local_78 = local_170 + lVar42;
              local_80 = local_190 + lVar42;
              local_88 = local_160 + lVar42;
              local_90 = local_e8 + lVar42;
              pwVar25 = (wchar_t *)(~(uint)local_120 + uVar35);
              local_138 = local_150 + lVar42;
              local_130 = local_f0 + lVar42;
              local_160 = pwVar9 + lVar42;
              pwVar32 = piVar28 + lVar42;
              local_148 = local_110 + lVar42;
              wVar38 = L'\x01';
              lVar22 = 0;
              wVar19 = L'\0';
              wVar30 = L'\0';
              p = local_100;
              local_150 = pwVar40 + lVar42;
              local_f0 = pwVar25;
              local_b8 = pwVar32;
              do {
                local_164 = local_130[lVar22];
                local_114 = local_148[lVar22];
                local_154 = local_138[lVar22];
                local_124 = local_150[lVar22];
                iVar31 = (int)lVar22;
                if ((((local_164 == pwVar32[lVar22]) && (local_114 == pwVar36[lVar42 + lVar22])) &&
                    (local_154 == piVar8[lVar42 + lVar22])) && (local_124 == local_160[lVar22])) {
                  local_e8 = (wchar_t *)CONCAT44(local_e8._4_4_,wVar30);
                  if (pwVar10[lVar42 + lVar22] == L'\0') {
LAB_001f055c:
                    wVar30 = local_90[lVar22];
                    wVar27 = local_88[lVar22];
                    wVar18 = local_80[lVar22];
                    wVar3 = local_78[lVar22];
                    local_dc = local_70[lVar22];
                    local_e0 = local_68[lVar22];
                    local_c4 = local_60[lVar22];
                    local_c8 = local_58[lVar22];
                    wVar20 = (*Term->dblh_hook)(wVar30,wVar27);
                    if ((((wVar20 == L'\0') &&
                         (wVar20 = (*Term->dblh_hook)(wVar18,wVar3), wVar20 == L'\0')) ||
                        ((((wVar20 = L'\x01', local_dc == wVar30 && (local_e0 == wVar27)) &&
                          (local_c4 == wVar18)) && (local_c8 == wVar3)))) &&
                       (wVar20 = L'\0', local_164 != L'ÿ' && (char)local_164 < '\0')) {
                      wVar20 = is_padding_changed(Term,y,uVar17 + iVar31);
                    }
                  }
                  else {
                    wVar30 = (*Term->dblh_hook)(local_164,local_114);
                    wVar20 = L'\x01';
                    if ((wVar30 == L'\0') &&
                       (wVar30 = (*Term->dblh_hook)(local_154,local_124), wVar30 == L'\0'))
                    goto LAB_001f055c;
                  }
                  pwVar32 = local_b8;
                  pwVar25 = local_f0;
                  p = local_100;
                  pwVar10[lVar42 + lVar22] = wVar20;
                  wVar30 = (wchar_t)local_e8;
                  if (wVar20 != L'\0') goto LAB_001f03cc;
                  if (wVar19 == L'\0') {
                    wVar19 = L'\0';
                  }
                  else {
                    if (wVar38 == L'\0' && (local_108 & 1) == 0) {
                      (*Term->wipe_hook)((wchar_t)local_e8,y,wVar19);
                    }
                    else {
                      (*Term->text_hook)((wchar_t)local_e8,y,wVar19,wVar38,
                                         local_110 + (wchar_t)local_e8);
                    }
LAB_001f06f8:
                    wVar19 = L'\0';
                  }
                }
                else {
                  pwVar10[lVar42 + lVar22] = L'\x01';
LAB_001f03cc:
                  pwVar32[lVar22] = local_164;
                  pwVar36[lVar42 + lVar22] = local_114;
                  piVar8[lVar42 + lVar22] = local_154;
                  local_160[lVar22] = local_124;
                  if ((char)local_164 < '\0') {
                    if (wVar19 != L'\0') {
                      if (wVar38 == L'\0' && (local_108 & 1) == 0) {
                        (*Term->wipe_hook)(wVar30,y,wVar19);
                      }
                      else {
                        (*Term->text_hook)(wVar30,y,wVar19,wVar38,local_110 + wVar30);
                      }
                    }
                    wVar19 = L'\0';
                    if (local_164 != L'ÿ') {
                      (*Term->pict_hook)(uVar17 + iVar31,y,L'\x01',&local_164,&local_114,&local_154,
                                         &local_124);
                      goto LAB_001f06f8;
                    }
                  }
                  else {
                    if (wVar38 != local_164) {
                      if (wVar19 != L'\0') {
                        if (wVar38 == L'\0' && (local_108 & 1) == 0) {
                          (*Term->wipe_hook)(wVar30,y,wVar19);
                        }
                        else {
                          (*Term->text_hook)(wVar30,y,wVar19,wVar38,local_110 + wVar30);
                        }
                      }
                      wVar19 = L'\0';
                      wVar38 = local_164;
                    }
                    bVar43 = wVar19 == L'\0';
                    wVar19 = wVar19 + L'\x01';
                    if (bVar43) {
                      wVar30 = uVar17 + iVar31;
                    }
                  }
                }
                ptVar39 = local_f8;
                pwVar40 = local_120;
                lVar22 = lVar22 + 1;
              } while ((int)pwVar25 + (int)lVar22 != 0);
              if (wVar19 != L'\0') {
                if (wVar38 == L'\0' && (local_108 & 1) == 0) {
                  (*Term->wipe_hook)(wVar30,y,wVar19);
                }
                else {
                  (*Term->text_hook)(wVar30,y,wVar19,wVar38,local_110 + wVar30);
                }
              }
              ptVar15 = Term;
              lVar42 = (long)pwVar40 + 1;
              if ((int)lVar42 < Term->wid) {
                do {
                  local_c0[lVar42] = L'\0';
                  lVar42 = lVar42 + 1;
                } while (lVar42 < ptVar15->wid);
              }
              goto LAB_001f0f6c;
            }
            ptVar26 = ptVar15->old;
            ptVar13 = ptVar15->scr;
            pwVar40 = ptVar13->c[lVar37];
            pwVar32 = ptVar13->tc[lVar37];
            piVar28 = ptVar13->ta[lVar37];
            local_160 = ptVar26->tc[lVar37] + lVar42;
            piVar8 = ptVar26->ta[lVar37];
            piVar11 = ptVar13->a[lVar37];
            pwVar36 = ptVar26->c[lVar37];
            piVar12 = ptVar26->a[lVar37];
            local_130 = (wchar_t *)CONCAT71(local_130._1_7_,ptVar15->always_text);
            local_150 = (wchar_t *)(ulong)uVar17;
            local_120 = (wchar_t *)((ulong)~uVar16 + (long)local_150);
            local_138 = (wchar_t *)CONCAT44(local_138._4_4_,1);
            lVar22 = 0;
            wVar38 = L'\0';
            wVar30 = L'\0';
            local_148 = pwVar40;
            do {
              local_154 = piVar11[lVar42 + lVar22];
              local_124 = pwVar40[lVar42 + lVar22];
              local_164 = piVar28[lVar42 + lVar22];
              local_114 = pwVar32[lVar42 + lVar22];
              iVar29 = (int)lVar22;
              if ((((local_154 == piVar12[lVar42 + lVar22]) &&
                   (local_124 == pwVar36[lVar42 + lVar22])) &&
                  (local_164 == piVar8[lVar42 + lVar22])) && (local_114 == local_160[lVar22])) {
                bVar43 = true;
                if (local_154 != L'ÿ' && (char)local_154 < '\0') {
                  wVar19 = is_padding_changed(Term,y,(int)local_150 + iVar29);
                  bVar43 = wVar19 == L'\0';
                }
                if (wVar38 != L'\0') {
                  if ((wchar_t)local_138 == L'\0' && ((ulong)local_130 & 1) == 0) {
                    (*Term->wipe_hook)(wVar30,y,wVar38);
                  }
                  else {
                    (*Term->text_hook)(wVar30,y,wVar38,(wchar_t)local_138,local_148 + wVar30);
                  }
                }
                wVar38 = L'\0';
                ptVar39 = local_f8;
                if (!bVar43) {
                  (*Term->pict_hook)((int)local_150 + iVar29,y,L'\x01',&local_154,&local_124,
                                     &local_164,&local_114);
                  ptVar39 = local_f8;
                }
              }
              else {
                piVar12[lVar42 + lVar22] = local_154;
                pwVar36[lVar42 + lVar22] = local_124;
                piVar8[lVar42 + lVar22] = local_164;
                local_160[lVar22] = local_114;
                if ((char)local_154 < '\0') {
                  if (wVar38 != L'\0') {
                    if ((wchar_t)local_138 == L'\0' && ((ulong)local_130 & 1) == 0) {
                      (*Term->wipe_hook)(wVar30,y,wVar38);
                    }
                    else {
                      (*Term->text_hook)(wVar30,y,wVar38,(wchar_t)local_138,local_148 + wVar30);
                    }
                  }
                  wVar38 = L'\0';
                  if (local_154 != L'ÿ') {
                    (*Term->pict_hook)((int)local_150 + iVar29,y,L'\x01',&local_154,&local_124,
                                       &local_164,&local_114);
                  }
                }
                else {
                  if ((wchar_t)local_138 != local_154) {
                    if (wVar38 != L'\0') {
                      if ((wchar_t)local_138 == L'\0' && ((ulong)local_130 & 1) == 0) {
                        (*Term->wipe_hook)(wVar30,y,wVar38);
                      }
                      else {
                        (*Term->text_hook)(wVar30,y,wVar38,(wchar_t)local_138,local_148 + wVar30);
                      }
                    }
                    wVar38 = L'\0';
                    local_138 = (wchar_t *)CONCAT44(local_138._4_4_,local_154);
                  }
                  bVar43 = wVar38 == L'\0';
                  wVar38 = wVar38 + L'\x01';
                  if (bVar43) {
                    wVar30 = (int)local_150 + iVar29;
                  }
                }
              }
              p = local_100;
              lVar22 = lVar22 + 1;
            } while ((int)local_120 + (int)lVar22 != 0);
            if (wVar38 != L'\0') {
              if ((wchar_t)local_138 == L'\0' && ((ulong)local_130 & 1) == 0) {
                (*Term->wipe_hook)(wVar30,y,wVar38);
              }
              else {
                (*Term->text_hook)(wVar30,y,wVar38,(wchar_t)local_138,local_148 + wVar30);
              }
            }
          }
          else {
            pwVar40 = ptVar15->scr->c[lVar37];
            local_160 = (wchar_t *)CONCAT71(local_160._1_7_,ptVar15->always_text);
            piVar28 = ptVar15->scr->a[lVar37];
            pwVar32 = ptVar15->old->c[lVar37];
            piVar8 = ptVar15->old->a[lVar37];
            wVar38 = L'\x01';
            lVar22 = 0;
            wVar19 = L'\0';
            wVar30 = L'\0';
            local_120 = pwVar40;
            do {
              wVar20 = piVar28[lVar42 + lVar22];
              wVar27 = pwVar40[lVar42 + lVar22];
              if ((wVar20 == piVar8[lVar42 + lVar22]) && (wVar27 == pwVar32[lVar42 + lVar22])) {
                if (wVar19 == L'\0') {
                  wVar19 = L'\0';
                }
                else {
                  if (wVar38 == L'\0' && ((ulong)local_160 & 1) == 0) {
                    (*Term->wipe_hook)(wVar30,y,wVar19);
                  }
                  else {
                    (*Term->text_hook)(wVar30,y,wVar19,wVar38,local_120 + wVar30);
                  }
                  wVar19 = L'\0';
                }
              }
              else {
                piVar8[lVar42 + lVar22] = wVar20;
                pwVar32[lVar42 + lVar22] = wVar27;
                wVar27 = wVar38;
                wVar18 = wVar19;
                if ((wVar38 != wVar20) && (wVar18 = L'\0', wVar27 = wVar20, wVar19 != L'\0')) {
                  if (wVar38 == L'\0' && ((ulong)local_160 & 1) == 0) {
                    (*Term->wipe_hook)(wVar30,y,wVar19);
                  }
                  else {
                    (*Term->text_hook)(wVar30,y,wVar19,wVar38,local_120 + wVar30);
                  }
                }
                wVar19 = wVar18 + L'\x01';
                wVar38 = wVar27;
                if (wVar18 == L'\0') {
                  wVar30 = uVar17 + (int)lVar22;
                }
              }
              p = local_100;
              lVar22 = lVar22 + 1;
            } while ((uVar16 - uVar17) + 1 != (int)lVar22);
            ptVar39 = local_f8;
            if (wVar19 != L'\0') {
              if (wVar38 == L'\0' && ((ulong)local_160 & 1) == 0) {
                (*Term->wipe_hook)(wVar30,y,wVar19);
                ptVar39 = local_f8;
              }
              else {
                (*Term->text_hook)(wVar30,y,wVar19,wVar38,local_120 + wVar30);
                ptVar39 = local_f8;
              }
            }
          }
          if ((Term->never_frosh == false) && (Term->xtra_hook != (_func_errr_wchar_t_wchar_t *)0x0)
             ) {
            (*Term->xtra_hook)(L'\x05',y);
          }
        }
        lVar37 = lVar37 + 1;
      } while (local_13c != (int)lVar37);
    }
    if (p != (void *)0x0) {
      if (tile_height != '\0') {
        uVar33 = 0;
        do {
          mem_free(*(void **)((long)p + uVar33 * 8));
          uVar33 = uVar33 + 1;
        } while (uVar33 < tile_height);
      }
      mem_free(p);
    }
  }
  ptVar26 = local_d8;
  if (Term->soft_cursor == true) {
    if ((local_d8->cu == false) && (local_d8->cv == true)) {
      if ((((1 < tile_width) || (1 < tile_height)) &&
          (((smlcurs == false && (Term->saved == '\0')) && (0 < local_d8->cy)))) ||
         (bigcurs == true)) {
        (*Term->bigcurs_hook)(local_d8->cx,local_d8->cy);
        local_d8->cnx = (uint)tile_width;
        uVar17 = (uint)tile_height;
        ptVar26 = local_d8;
        goto LAB_001f1028;
      }
      (*Term->curs_hook)(local_d8->cx,local_d8->cy);
    }
    local_d8->cnx = 1;
    uVar17 = 1;
    ptVar26 = local_d8;
  }
  else {
    if (local_d8->cu == false) {
      _Var1 = local_d8->cv;
      (*Term->curs_hook)(local_d8->cx,local_d8->cy);
      if ((_Var1 == true) && (Term->xtra_hook != (_func_errr_wchar_t_wchar_t *)0x0)) {
        (*Term->xtra_hook)(L'\x04',L'\x01');
      }
    }
    else {
      (*Term->curs_hook)((int)local_d0 + L'\xffffffff',local_d8->cy);
    }
    ptVar26->cnx = 1;
    uVar17 = 1;
  }
LAB_001f1028:
  ptVar26->cny = uVar17;
  ptVar39->cu = ptVar26->cu;
  ptVar39->cv = ptVar26->cv;
  ptVar39->cx = ptVar26->cx;
  ptVar39->cy = ptVar26->cy;
  ptVar39->cnx = ptVar26->cnx;
  ptVar39->cny = ptVar26->cny;
  if (Term->xtra_hook != (_func_errr_wchar_t_wchar_t *)0x0) {
    (*Term->xtra_hook)(L'\x06',L'\0');
  }
  return 0;
}

Assistant:

errr Term_fresh(void)
{
	int x, y;

	int w = Term->wid;
	int h = Term->hgt;

	int y1 = Term->y1;
	int y2 = Term->y2;

	term_win *old = Term->old;
	term_win *scr = Term->scr;


	/* Do nothing unless "mapped" */
	if (!Term->mapped_flag) return (1);


	/* Trivial Refresh */
	if ((y1 > y2) &&
	    (scr->cu == old->cu) &&
	    (scr->cv == old->cv) &&
	    (scr->cx == old->cx) &&
	    (scr->cy == old->cy) &&
	    (scr->cnx == old->cnx) &&
	    (scr->cny == old->cny) &&
	    !(Term->total_erase)) {
		/* Nothing */
		return (1);
	}


	/* Paranoia -- use "fake" hooks to prevent core dumps */
	if (!Term->curs_hook) Term->curs_hook = Term_curs_hack;
	if (!Term->bigcurs_hook) Term->bigcurs_hook = Term->curs_hook;
	if (!Term->wipe_hook) Term->wipe_hook = Term_wipe_hack;
	if (!Term->text_hook) Term->text_hook = Term_text_hack;
	if (!Term->pict_hook) Term->pict_hook = Term_pict_hack;


	/* Handle "total erase" */
	if (Term->total_erase) {
		/* Physically erase the entire window */
		Term_xtra(TERM_XTRA_CLEAR, 0);

		/* Hack -- clear all "cursor" data */
		old->cv = old->cu = false;
		old->cx = old->cy = 0;
		old->cnx = old->cny = 1;

		/* Wipe each row */
		for (y = 0; y < h; y++) {
			int *aa = old->a[y];
			wchar_t *cc = old->c[y];
			int *taa = old->ta[y];
			wchar_t *tcc = old->tc[y];

			/* Wipe each column */
			for (x = 0; x < w; x++) {
				/* Wipe each grid */
				*aa++ = COLOUR_WHITE;
				*cc++ = ' ';

				*taa++ = COLOUR_WHITE;
				*tcc++ = ' ';
			}
		}

		/* Redraw every row */
		Term->y1 = y1 = 0;
		Term->y2 = y2 = h - 1;

		/* Redraw every column */
		for (y = 0; y < h; y++) {
			Term->x1[y] = 0;
			Term->x2[y] = w - 1;
		}

		/* Forget "total erase" */
		Term->total_erase = false;
	}


	/* Cursor update -- Erase old Cursor */
	if (Term->soft_cursor) {
		/* Cursor was visible */
		if (!old->cu && old->cv) {
		        /*
		         * Fake a change at the old cursor position so that
		         * position will be redrawn along with any other
			 * changes.
			 */
			int mty = MAX(old->cy,
				MIN(old->cy + old->cny - 1, h - 1));
			int mtx = MAX(old->cx,
				MIN(old->cx + old->cnx - 1, w - 1));
			int ty;

			for (ty = old->cy; ty <= mty; ++ty) {
				int tx;

				for (tx = old->cx; tx <= mtx; ++tx) {
					old->c[ty][tx] = ~scr->c[ty][tx];
				}
				if (Term->x1[ty] > old->cx) {
					Term->x1[ty] = old->cx;
				}
				if (Term->x2[ty] < mtx) {
					Term->x2[ty] = mtx;
				}
			}
			if (y1 > old->cy) {
			    y1 = old->cy;
			}
			if (y2 < mty) {
			    y2 = mty;
			}
		}
	} else {
		/* Cursor will be invisible */
		if (scr->cu || !scr->cv)
			Term_xtra(TERM_XTRA_SHAPE, 0);
	}


	/* Something to update */
	if (y1 <= y2) {
		int **pr_drw;
		int ipr;

		if (Term->dblh_hook && (Term->always_pict ||
				Term->higher_pict)) {
			/*
			 * Have to track whether each location in the previous
			 * tile_height rows was redrawn.  First dimension in
			 * pr_drw will be treated circularly so there's no
			 * need for copying or swapping pointers.
			 */
			pr_drw = mem_alloc(tile_height * sizeof(*pr_drw));
			for (y = 0; y < tile_height; ++y) {
				pr_drw[y] = mem_zalloc(w * sizeof(**pr_drw));
			}
		} else {
			pr_drw = NULL;
		}

		/* Handle "icky corner" */
		if ((Term->icky_corner) && (y2 >= h - 1) && (Term->x2[h - 1] > w - 2))
			Term->x2[h - 1] = w - 2;


		/*
		 * Make the stored y bounds for the modified region empty.
		 * Do so before drawing so that Term_mark() calls from within
		 * the drawing hooks will adjust the bounds on the modified
		 * region for the next update.
		 */
		Term->y1 = h;
		Term->y2 = 0;

		/* Scan the "modified" rows */
		ipr = 0;
		for (y = y1; y <= y2; ++y) {
			int x1 = Term->x1[y];
			int x2 = Term->x2[y];

			/* Flush each "modified" row */
			if (x1 <= x2) {
				/*
				 * As above, set the bounds for the modified
				 * region to be empty before drawing.
				 */
				Term->x1[y] = w;
				Term->x2[y] = 0;

				/* Use "Term_pict()" - always, sometimes or never */
				if (Term->always_pict) {
					/* Flush the row */
					if (Term->dblh_hook) {
						Term_fresh_row_pict_dblh(
							y, x1, x2, pr_drw[ipr]);
						ipr = (ipr + 1) % tile_height;
					} else {
						Term_fresh_row_pict(y, x1, x2);
					}
				} else if (Term->higher_pict) {
					/* Flush the row */
					if (Term->dblh_hook) {
						Term_fresh_row_both_dblh(
							y, x1, x2, pr_drw[ipr]);
						ipr = (ipr + 1) % tile_height;
					} else {
						Term_fresh_row_both(y, x1, x2);
					}
				} else {
					/* Flush the row */
					Term_fresh_row_text(y, x1, x2);
				}
				/* Hack -- Flush that row (if allowed) */
				if (!Term->never_frosh) Term_xtra(TERM_XTRA_FROSH, y);
			} else if (pr_drw) {
				/*
				 * Remember that nothing was redrawn on that
				 * row.
				 */
				for (x = 0; x < w; ++x) {
					pr_drw[ipr][x] = 0;
				}
				ipr = (ipr + 1) % tile_height;
			}
		}

		if (pr_drw) {
			for (y = 0; y < tile_height; ++y) {
				mem_free(pr_drw[y]);
			}
			mem_free(pr_drw);
		}
	}


	/* Cursor update -- Show new Cursor */
	if (Term->soft_cursor) {
		/* Draw the (large or small) cursor */
		if (!scr->cu && scr->cv) {
			if ((((tile_width > 1)||(tile_height > 1)) &&
			     (!smlcurs) && (Term->saved == 0) && (scr->cy > 0))
			    || bigcurs) {
				(void)((*Term->bigcurs_hook)(scr->cx, scr->cy));
				scr->cnx = tile_width;
				scr->cny = tile_height;
			} else {
				(void)((*Term->curs_hook)(scr->cx, scr->cy));
				scr->cnx = 1;
				scr->cny = 1;
			}
		} else {
			scr->cnx = 1;
			scr->cny = 1;
		}
	} else {
		/* The cursor is useless or invisible ignore it, otherwise display */
		if (scr->cu) {
			/* Paranoia -- Put the cursor NEAR where it belongs */
			(void)((*Term->curs_hook)(w - 1, scr->cy));
		} else if (!scr->cv) {
			/* Paranoia -- Put the cursor where it belongs */
			(void)((*Term->curs_hook)(scr->cx, scr->cy));
		} else {
			/* Put the cursor where it belongs */
			(void)((*Term->curs_hook)(scr->cx, scr->cy));

			/* Make the cursor visible */
			Term_xtra(TERM_XTRA_SHAPE, 1);
		}

		scr->cnx = 1;
		scr->cny = 1;
	}

	/* Save the "cursor state" */
	old->cu = scr->cu;
	old->cv = scr->cv;
	old->cx = scr->cx;
	old->cy = scr->cy;
	old->cnx = scr->cnx;
	old->cny = scr->cny;

	/* Actually flush the output */
	Term_xtra(TERM_XTRA_FRESH, 0);

	/* Success */
	return (0);
}